

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O2

axbStatus_t axbVecCopy(axbVec_s *x,axbVec_s *y)

{
  axbOpDescriptor_t *paVar1;
  axbStatus_t aVar2;
  
  if ((x->init == 0x1d232) && (y->init == 0x1d232)) {
    paVar1 = y->opBackend->op_table;
    (*paVar1[0xe].func)(x,y,paVar1[0xe].func_data);
    aVar2 = 0;
  }
  else {
    fwrite("Vector not fully initialized!\n",0x1e,1,_stderr);
    aVar2 = 0x1d232;
  }
  return aVar2;
}

Assistant:

axbStatus_t axbVecCopy(const struct axbVec_s *x, struct axbVec_s *y)
{
  AXB_VECTOR_INIT_CHECK(x);
  AXB_VECTOR_INIT_CHECK(y);

  axbOpDescriptor_t op_desc = y->opBackend->op_table[AXB_OP_VEC_COPY];
  axbStatus_t (*op)(const struct axbVec_s *, struct axbVec_s *, void*) = (axbStatus_t (*)(const struct axbVec_s *, struct axbVec_s *, void*)) op_desc.func;
  op(x, y, op_desc.func_data);
  return 0;
}